

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_script.c
# Opt level: O0

void ngx_http_script_full_name_code(ngx_http_script_engine_t *e)

{
  ngx_int_t nVar1;
  ngx_str_t *local_38;
  ngx_str_t *prefix;
  ngx_str_t value;
  ngx_http_script_full_name_code_t *code;
  ngx_http_script_engine_t *e_local;
  
  value.data = e->ip;
  value.len = (size_t)(e->buf).data;
  prefix = (ngx_str_t *)(e->pos + -(long)(e->buf).data);
  if (*(long *)(value.data + 8) == 0) {
    local_38 = &ngx_cycle->prefix;
  }
  else {
    local_38 = &ngx_cycle->conf_prefix;
  }
  nVar1 = ngx_get_full_name(e->request->pool,local_38,(ngx_str_t *)&prefix);
  if (nVar1 == 0) {
    (e->buf).len = (size_t)prefix;
    (e->buf).data = (u_char *)value.len;
    if ((e->request->connection->log->log_level & 0x100) != 0) {
      ngx_log_error_core(8,e->request->connection->log,0,"http script fullname: \"%V\"",&prefix);
    }
    e->ip = e->ip + 0x10;
  }
  else {
    e->ip = (u_char *)&ngx_http_script_exit_code;
    e->status = 500;
  }
  return;
}

Assistant:

static void
ngx_http_script_full_name_code(ngx_http_script_engine_t *e)
{
    ngx_http_script_full_name_code_t  *code;

    ngx_str_t  value, *prefix;

    code = (ngx_http_script_full_name_code_t *) e->ip;

    value.data = e->buf.data;
    value.len = e->pos - e->buf.data;

    prefix = code->conf_prefix ? (ngx_str_t *) &ngx_cycle->conf_prefix:
                                 (ngx_str_t *) &ngx_cycle->prefix;

    if (ngx_get_full_name(e->request->pool, prefix, &value) != NGX_OK) {
        e->ip = ngx_http_script_exit;
        e->status = NGX_HTTP_INTERNAL_SERVER_ERROR;
        return;
    }

    e->buf = value;

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, e->request->connection->log, 0,
                   "http script fullname: \"%V\"", &value);

    e->ip += sizeof(ngx_http_script_full_name_code_t);
}